

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O0

void __thiscall wasm::StackIRGenerator::emitUnreachable(StackIRGenerator *this)

{
  Expression *origin;
  Builder local_20;
  StackInst *local_18;
  StackIRGenerator *local_10;
  StackIRGenerator *this_local;
  
  local_10 = this;
  Builder::Builder(&local_20,this->module);
  origin = (Expression *)Builder::makeUnreachable(&local_20);
  local_18 = makeStackInst(this,origin);
  std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::push_back
            (&this->stackIR,&local_18);
  return;
}

Assistant:

void emitUnreachable() {
    stackIR.push_back(makeStackInst(Builder(module).makeUnreachable()));
  }